

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O1

Result wabt::WriteBinarySpecScript
                 (Stream *json_stream,Script *script,string_view source_filename,
                 string_view module_filename_noext,WriteBinaryOptions *options,
                 vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
                 *out_module_streams,Stream *log_stream)

{
  Result RVar1;
  BinaryWriterSpec binary_writer_spec;
  vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_> **local_e8
  ;
  Stream **ppSStack_e0;
  code *local_d8;
  code *pcStack_d0;
  size_t local_c8;
  char *pcStack_c0;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  BinaryWriterSpec local_98;
  
  pcStack_c0 = module_filename_noext._M_str;
  local_c8 = module_filename_noext._M_len;
  local_e8 = &out_module_streams;
  ppSStack_e0 = &log_stream;
  pcStack_d0 = std::
               _Function_handler<wabt::Stream_*(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/binary-writer-spec.cc:668:7)>
               ::_M_invoke;
  local_d8 = std::
             _Function_handler<wabt::Stream_*(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/binary-writer-spec.cc:668:7)>
             ::_M_manager;
  pcStack_a0 = std::
               _Function_handler<wabt::Stream_*(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/binary-writer-spec.cc:668:7)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<wabt::Stream_*(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/binary-writer-spec.cc:668:7)>
             ::_M_manager;
  local_b8._M_unused._M_object = local_e8;
  local_b8._8_8_ = ppSStack_e0;
  anon_unknown_1::BinaryWriterSpec::BinaryWriterSpec
            (&local_98,json_stream,(WriteBinarySpecStreamFactory *)&local_b8,source_filename,
             module_filename_noext,options);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  RVar1 = anon_unknown_1::BinaryWriterSpec::WriteScript(&local_98,script);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.module_filename_noext_._M_dataplus._M_p !=
      &local_98.module_filename_noext_.field_2) {
    operator_delete(local_98.module_filename_noext_._M_dataplus._M_p,
                    local_98.module_filename_noext_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.source_filename_._M_dataplus._M_p != &local_98.source_filename_.field_2) {
    operator_delete(local_98.source_filename_._M_dataplus._M_p,
                    local_98.source_filename_.field_2._M_allocated_capacity + 1);
  }
  if (local_98.module_stream_factory_.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_98.module_stream_factory_.super__Function_base._M_manager)
              ((_Any_data *)&local_98.module_stream_factory_,
               (_Any_data *)&local_98.module_stream_factory_,__destroy_functor);
  }
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,3);
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result WriteBinarySpecScript(
    Stream* json_stream,
    Script* script,
    std::string_view source_filename,
    std::string_view module_filename_noext,
    const WriteBinaryOptions& options,
    std::vector<FilenameMemoryStreamPair>* out_module_streams,
    Stream* log_stream) {
  WriteBinarySpecStreamFactory module_stream_factory =
      [&](std::string_view filename) {
        out_module_streams->emplace_back(
            filename, std::make_unique<MemoryStream>(log_stream));
        return out_module_streams->back().stream.get();
      };

  BinaryWriterSpec binary_writer_spec(json_stream, module_stream_factory,
                                      source_filename, module_filename_noext,
                                      options);
  return binary_writer_spec.WriteScript(*script);
}